

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

char * __thiscall TCPConnection::GetStateString(TCPConnection *this)

{
  char *local_18;
  char *rc;
  TCPConnection *this_local;
  
  switch(this->State) {
  case CLOSED:
    local_18 = "CLOSED";
    break;
  case LISTEN:
    local_18 = "LISTEN";
    break;
  case SYN_SENT:
    local_18 = "SYN_SENT";
    break;
  case SYN_RECEIVED:
    local_18 = "SYN_RECEIVED";
    break;
  case ESTABLISHED:
    local_18 = "ESTABLISHED";
    break;
  case FIN_WAIT_1:
    local_18 = "FIN_WAIT_1";
    break;
  case FIN_WAIT_2:
    local_18 = "FIN_WAIT_2";
    break;
  case CLOSE_WAIT:
    local_18 = "CLOSE_WAIT";
    break;
  case CLOSING:
    local_18 = "CLOSING";
    break;
  case LAST_ACK:
    local_18 = "LAST_ACK";
    break;
  case TIMED_WAIT:
    local_18 = "TIMED_WAIT";
    break;
  case TTCP_PERSIST:
    local_18 = "TTCP_PERSIST";
  }
  return local_18;
}

Assistant:

const char* TCPConnection::GetStateString() const
{
    const char* rc;
    switch (State)
    {
    case TCPConnection::CLOSED: rc = "CLOSED"; break;
    case TCPConnection::LISTEN: rc = "LISTEN"; break;
    case TCPConnection::SYN_SENT: rc = "SYN_SENT"; break;
    case TCPConnection::SYN_RECEIVED: rc = "SYN_RECEIVED"; break;
    case TCPConnection::ESTABLISHED: rc = "ESTABLISHED"; break;
    case TCPConnection::FIN_WAIT_1: rc = "FIN_WAIT_1"; break;
    case TCPConnection::FIN_WAIT_2: rc = "FIN_WAIT_2"; break;
    case TCPConnection::CLOSE_WAIT: rc = "CLOSE_WAIT"; break;
    case TCPConnection::CLOSING: rc = "CLOSING"; break;
    case TCPConnection::LAST_ACK: rc = "LAST_ACK"; break;
    case TCPConnection::TIMED_WAIT: rc = "TIMED_WAIT"; break;
    case TCPConnection::TTCP_PERSIST: rc = "TTCP_PERSIST"; break;
    }
    return rc;
}